

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

void QHttpHeadersPrivate::replaceOrAppend(Self *d,HeaderName *name,QByteArray *value)

{
  bool bVar1;
  iterator abegin;
  iterator aend;
  iterator iVar2;
  iterator __pred;
  anon_class_8_1_898f2789_for__M_pred this;
  QHttpHeadersPrivate *pQVar3;
  HeaderName *in_RSI;
  long in_FS_OFFSET;
  iterator it;
  QByteArray *in_stack_ffffffffffffff28;
  rvalue_ref t;
  Header *in_stack_ffffffffffffff30;
  QList<Header> *this_00;
  anon_class_8_1_898f2789_for__M_pred in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff68;
  const_iterator local_58;
  const_iterator local_50;
  iterator local_48 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)in_stack_ffffffffffffff30);
  local_48[0].i = (Header *)0xaaaaaaaaaaaaaaaa;
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c59e3);
  abegin = QList<Header>::begin(in_stack_ffffffffffffff30);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c59fe);
  aend = QList<Header>::end(in_stack_ffffffffffffff30);
  headerNameMatches(in_RSI);
  local_48[0] = std::find_if<QList<Header>::iterator,headerNameMatches(HeaderName_const&)::__0>
                          (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                           in_stack_ffffffffffffff58);
  QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
            ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5a44);
  iVar2 = QList<Header>::end(in_stack_ffffffffffffff30);
  bVar1 = QList<Header>::iterator::operator!=(local_48,iVar2);
  if (bVar1) {
    QList<Header>::iterator::operator->(local_48);
    QByteArray::operator=((QByteArray *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    pQVar3 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5a98);
    this_00 = &pQVar3->headers;
    iVar2 = QList<Header>::iterator::operator+
                      ((iterator *)this_00,(qsizetype)in_stack_ffffffffffffff28);
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5ac2);
    __pred = QList<Header>::end(this_00);
    this = headerNameMatches(in_RSI);
    iVar2 = std::remove_if<QList<Header>::iterator,headerNameMatches(HeaderName_const&)::__0>
                      (in_stack_ffffffffffffff68,iVar2,__pred.i);
    QList<Header>::const_iterator::const_iterator(&local_50,iVar2);
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5b17);
    iVar2 = QList<Header>::end(this_00);
    QList<Header>::const_iterator::const_iterator(&local_58,iVar2);
    QList<Header>::erase((QList<Header> *)this.name,(const_iterator)abegin.i,(const_iterator)aend.i)
    ;
  }
  else {
    pQVar3 = QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
                       ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c5b65);
    t = (rvalue_ref)&pQVar3->headers;
    HeaderName::HeaderName(&in_stack_ffffffffffffff30->name,(HeaderName *)t);
    QByteArray::QByteArray((QByteArray *)in_stack_ffffffffffffff30,(QByteArray *)t);
    QList<Header>::append((QList<Header> *)in_stack_ffffffffffffff30,t);
    Header::~Header(in_stack_ffffffffffffff30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpHeadersPrivate::replaceOrAppend(Self &d, const HeaderName &name, QByteArray value)
{
    d.detach();
    auto it = std::find_if(d->headers.begin(), d->headers.end(), headerNameMatches(name));
    if (it != d->headers.end()) {
        // Found something to replace => replace, and then rearrange any remaining
        // matches to the end and erase them
        it->value = std::move(value);
        d->headers.erase(
                std::remove_if(it + 1, d->headers.end(), headerNameMatches(name)),
                d->headers.end());
    } else {
        // Found nothing to replace => append
        d->headers.append(Header{name, std::move(value)});
    }
}